

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O0

CURLcode Curl_hmac_md5(uchar *key,uint keylen,uchar *data,uint datalen,uchar *output)

{
  HMAC_context *ctxt_00;
  HMAC_context *ctxt;
  uchar *output_local;
  uint datalen_local;
  uchar *data_local;
  uint keylen_local;
  uchar *key_local;
  
  ctxt_00 = Curl_HMAC_init(Curl_HMAC_MD5,key,keylen);
  if (ctxt_00 == (HMAC_context *)0x0) {
    key_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    Curl_HMAC_update(ctxt_00,data,datalen);
    Curl_HMAC_final(ctxt_00,output);
    key_local._4_4_ = CURLE_OK;
  }
  return key_local._4_4_;
}

Assistant:

CURLcode Curl_hmac_md5(const unsigned char *key, unsigned int keylen,
                       const unsigned char *data, unsigned int datalen,
                       unsigned char *output)
{
  HMAC_context *ctxt = Curl_HMAC_init(Curl_HMAC_MD5, key, keylen);

  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  /* Update the digest with the given challenge */
  Curl_HMAC_update(ctxt, data, datalen);

  /* Finalise the digest */
  Curl_HMAC_final(ctxt, output);

  return CURLE_OK;
}